

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_traits.hpp
# Opt level: O3

type jsoncons::unicode_traits::detect_json_encoding<char>(char *data,size_t length)

{
  type tVar1;
  type tVar2;
  type tVar3;
  type tVar4;
  type tVar5;
  type tVar6;
  
  tVar6 = detect_encoding_from_bom<char>(data,length);
  if (tVar6.encoding == undetected) {
    tVar3._8_8_ = 1;
    tVar3.ptr = data;
    tVar2._8_8_ = 1;
    tVar2.ptr = data;
    tVar1._8_8_ = 1;
    tVar1.ptr = data;
    tVar6._8_8_ = 1;
    tVar6.ptr = data;
    if (3 < length) {
      if (*data == '\0') {
        if (data[1] != '\0') {
          if (data[2] != '\0') {
            return tVar3;
          }
          tVar4._8_8_ = 3;
          tVar4.ptr = data;
          return tVar4;
        }
        if (data[2] == '\0') {
          tVar5._8_8_ = 5;
          tVar5.ptr = data;
          return tVar5;
        }
      }
      else if (data[1] != '\0') {
        return tVar1;
      }
      tVar6 = tVar2;
      if (data[3] == '\0') {
        tVar6.encoding = (uint)(data[2] == '\0') * 2 + 2;
        tVar6._12_4_ = 0;
      }
    }
  }
  return tVar6;
}

Assistant:

typename std::enable_if<ext_traits::is_char8<CharT>::value,detect_encoding_result<CharT>>::type
    detect_json_encoding(const CharT* data, std::size_t length)
    {
        detect_encoding_result<CharT> r = detect_encoding_from_bom(data,length);
        if (r.encoding != encoding_kind::undetected)
        {
            return r;
        }
        else if (length < 4)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf8};
        }
        else if (*data == 0 && *(data+1) == 0 && *(data+2) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf32be};
        }
        else if (*data == 0 && *(data+2) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf16be};
        }
        else if (*(data+1) == 0 && *(data+2) == 0 && *(data+3) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf32le};
        }
        else if (*(data+1) == 0 && *(data+3) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf16le};
        }
        else
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf8};
        }
    }